

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall
wasm::ValidationInfo::shouldBeTrue<wasm::FeatureSet>
          (ValidationInfo *this,bool result,FeatureSet curr,char *text,Function *func)

{
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Function *local_30;
  Function *func_local;
  char *text_local;
  ValidationInfo *pVStack_18;
  bool result_local;
  ValidationInfo *this_local;
  FeatureSet curr_local;
  
  if (!result) {
    local_30 = func;
    func_local = (Function *)text;
    text_local._7_1_ = result;
    pVStack_18 = this;
    this_local._0_4_ = curr.features;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,text,&local_71);
    std::operator+(&local_50,"unexpected false: ",&local_70);
    fail<wasm::FeatureSet,std::__cxx11::string>(this,&local_50,this_local._0_4_,local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return result;
}

Assistant:

bool shouldBeTrue(bool result,
                    T curr,
                    const char* text,
                    Function* func = nullptr) {
    if (!result) {
      fail("unexpected false: " + std::string(text), curr, func);
      return false;
    }
    return true;
  }